

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O1

void __thiscall Triangle_Watertight_Test::TestBody(Triangle_Watertight_Test *this)

{
  Point3<float> *__args;
  ulong uVar1;
  ulong uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> n;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> uv;
  vector<int,_std::allocator<int>_> faceIndices;
  byte bVar10;
  AssertHelper AVar11;
  ShapeHandle *pSVar12;
  bool bVar13;
  undefined8 uVar14;
  Allocator alloc;
  byte bVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  char *pcVar21;
  uint uVar22;
  int iVar23;
  uint64_t oldstate;
  ulong uVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 auVar38 [16];
  float fVar36;
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar42 [64];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar43 [64];
  undefined1 auVar37 [16];
  undefined1 auVar41 [32];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_ZMM5 [64];
  undefined4 uVar49;
  float in_stack_fffffffffffffc08;
  float in_stack_fffffffffffffc0c;
  int nPhi;
  int nTheta;
  vector<int,_std::allocator<int>_> indices;
  DispatchSplit<6> local_3c5;
  int nHits;
  AssertionResult gtest_ar_4;
  AssertHelper local_3b0;
  undefined1 local_3a8 [16];
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> vertices;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  int nVertices;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> tris;
  ulong local_2e8;
  float local_2e0;
  undefined8 local_2dc;
  float local_2d4;
  undefined4 local_2d0;
  undefined8 local_2c8;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> local_2c0;
  vector<int,_std::allocator<int>_> local_2a8;
  AssertionResult gtest_ar;
  long local_280 [30];
  char local_190;
  TriangleMesh mesh;
  void *local_148;
  undefined8 uStack_140;
  long local_138;
  void *local_128;
  undefined8 uStack_120;
  long local_118;
  void *local_108;
  undefined8 uStack_100;
  long local_f8;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> local_e8;
  Transform identity;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  nTheta = 0x10;
  nPhi = 0x10;
  identity.m.m[0][0] = 4.2039e-45;
  testing::internal::CmpHelperGE<int,int>
            ((internal *)&gtest_ar,"nTheta","3",&nTheta,(int *)&identity);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&identity);
    if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) ==
        (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mesh,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes_test.cpp"
               ,0x22,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mesh,(Message *)&identity);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mesh);
    if (identity.m.m[0]._0_8_ != 0) {
      bVar13 = testing::internal::IsTrue(true);
      if ((bVar13) && (identity.m.m[0]._0_8_ != 0)) {
        (**(code **)(*(long *)identity.m.m[0]._0_8_ + 8))();
      }
      identity.m.m[0][0] = 0.0;
      identity.m.m[0][1] = 0.0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    identity.m.m[0][0] = 5.60519e-45;
    testing::internal::CmpHelperGE<int,int>((internal *)&gtest_ar,"nPhi","4",&nPhi,(int *)&identity)
    ;
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&identity);
      if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) ==
          (undefined8 *)0x0) {
        pcVar21 = "";
      }
      else {
        pcVar21 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&mesh,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes_test.cpp"
                 ,0x23,pcVar21);
      testing::internal::AssertHelper::operator=((AssertHelper *)&mesh,(Message *)&identity);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mesh);
      if (identity.m.m[0]._0_8_ != 0) {
        bVar13 = testing::internal::IsTrue(true);
        if ((bVar13) && (identity.m.m[0]._0_8_ != 0)) {
          (**(code **)(*(long *)identity.m.m[0]._0_8_ + 8))();
        }
        identity.m.m[0][0] = 0.0;
        identity.m.m[0][1] = 0.0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      nVertices = nPhi * nTheta;
      vertices.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vertices.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vertices.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (0 < nTheta) {
        uVar24 = 0x5f6f467652a01b04;
        iVar17 = 0;
        do {
          fVar35 = ((float)iVar17 * 3.1415927) / (float)(nTheta + -1);
          local_3a8._0_4_ = fVar35;
          fVar35 = cosf(fVar35);
          auVar42._0_4_ = sinf((float)local_3a8._0_4_);
          auVar42._4_60_ = extraout_var;
          if (0 < nPhi) {
            auVar33 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar42._0_16_);
            uVar14 = vcmpss_avx512f(auVar42._0_16_,SUB6416(ZEXT464(0xbf800000),0),1);
            bVar13 = (bool)((byte)uVar14 & 1);
            fVar32 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * auVar33._0_4_);
            auVar33 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar35));
            uVar14 = vcmpss_avx512f(ZEXT416((uint)fVar35),SUB6416(ZEXT464(0xbf800000),0),1);
            bVar13 = (bool)((byte)uVar14 & 1);
            local_318._4_12_ = auVar33._4_12_;
            local_318._0_4_ = (uint)bVar13 * -0x40800000 + (uint)!bVar13 * auVar33._0_4_;
            iVar25 = 0;
            do {
              if (iVar17 == 0) {
                gtest_ar.success_ = false;
                gtest_ar._1_7_ = 0;
                gtest_ar.message_.ptr_._0_4_ = 1.0;
                if (vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>::
                  _M_realloc_insert<pbrt::Point3<float>>
                            ((vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>> *)
                             &vertices,
                             (iterator)
                             vertices.
                             super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(Point3<float> *)&gtest_ar);
                }
                else {
LAB_0029a52b:
                  gtest_ar.success_ = false;
                  gtest_ar._1_7_ = 0;
                  ((vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Point3,_float>).z
                       = gtest_ar.message_.ptr_._0_4_;
                  uVar14 = 0;
LAB_0029a53d:
                  ((vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Point3,_float>).x
                       = (float)(int)uVar14;
                  ((vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Point3,_float>).y
                       = (float)(int)((ulong)uVar14 >> 0x20);
                  vertices.
                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       vertices.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
              else if (iVar17 == nTheta + -1) {
                gtest_ar.success_ = false;
                gtest_ar._1_7_ = 0;
                gtest_ar.message_.ptr_._0_4_ = -1.0;
                if (vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0029a52b;
                std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>::
                _M_realloc_insert<pbrt::Point3<float>>
                          ((vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>> *)
                           &vertices,
                           (iterator)
                           vertices.
                           super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(Point3<float> *)&gtest_ar);
              }
              else {
                iVar28 = nPhi + -1;
                if (iVar25 == iVar28) {
                  __args = vertices.
                           super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                           (((ulong)((long)vertices.
                                           super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)vertices.
                                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                            -0x5555555555555555 - (long)iVar28);
                  if (vertices.
                      super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      vertices.
                      super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    ((vertices.
                      super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Point3,_float>
                    ).z = (__args->super_Tuple3<pbrt::Point3,_float>).z;
                    uVar14._0_4_ = (__args->super_Tuple3<pbrt::Point3,_float>).x;
                    uVar14._4_4_ = (__args->super_Tuple3<pbrt::Point3,_float>).y;
                    goto LAB_0029a53d;
                  }
                  std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>::
                  _M_realloc_insert<pbrt::Point3<float>const&>
                            ((vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>> *)
                             &vertices,
                             (iterator)
                             vertices.
                             super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,__args);
                }
                else {
                  fVar35 = ((float)iVar25 * 6.2831855) / (float)iVar28;
                  uVar22 = (uint)(uVar24 >> 0x2d) ^ (uint)(uVar24 >> 0x1b);
                  bVar15 = (byte)(uVar24 >> 0x3b);
                  auVar33 = vcvtusi2ss_avx512f(in_ZMM5._0_16_,
                                               uVar22 >> bVar15 | uVar22 << 0x20 - bVar15);
                  local_3a8 = vminss_avx(ZEXT416((uint)(auVar33._0_4_ * 2.3283064e-10)),
                                         ZEXT416(0x3f7fffff));
                  fVar36 = cosf(fVar35);
                  auVar43._0_4_ = sinf(fVar35);
                  auVar43._4_60_ = extraout_var_00;
                  auVar33 = vfmadd213ss_fma(local_3a8,SUB6416(ZEXT464(0x40a00000),0),
                                            ZEXT416(0x3f800000));
                  fVar35 = auVar33._0_4_;
                  gtest_ar.message_.ptr_._0_4_ = fVar35 * (float)local_318._0_4_ + 0.0;
                  auVar33._4_4_ = extraout_XMM0_Db;
                  auVar33._0_4_ = fVar36;
                  auVar33._8_4_ = extraout_XMM0_Dc;
                  auVar33._12_4_ = extraout_XMM0_Dd;
                  auVar33 = vinsertps_avx(auVar33,auVar43._0_16_,0x10);
                  auVar34._0_4_ = fVar35 * auVar33._0_4_ * fVar32 + 0.0;
                  auVar34._4_4_ = fVar35 * auVar33._4_4_ * fVar32 + 0.0;
                  auVar34._8_4_ = fVar35 * auVar33._8_4_ * fVar32 + 0.0;
                  auVar34._12_4_ = fVar35 * auVar33._12_4_ * fVar32 + 0.0;
                  gtest_ar._0_8_ = vmovlps_avx(auVar34);
                  if (vertices.
                      super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish ==
                      vertices.
                      super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>::
                    _M_realloc_insert<pbrt::Point3<float>>
                              ((vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>> *)
                               &vertices,
                               (iterator)
                               vertices.
                               super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,(Point3<float> *)&gtest_ar
                              );
                  }
                  else {
                    ((vertices.
                      super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Point3,_float>
                    ).z = gtest_ar.message_.ptr_._0_4_;
                    *(undefined8 *)
                     &(vertices.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->
                      super_Tuple3<pbrt::Point3,_float> = gtest_ar._0_8_;
                    vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         vertices.
                         super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  uVar24 = uVar24 * 0x5851f42d4c957f2d + 0x5e9f;
                }
              }
              iVar25 = iVar25 + 1;
            } while (iVar25 < nPhi);
          }
          iVar17 = iVar17 + 1;
        } while (iVar17 < nTheta);
      }
      identity.m.m[0]._0_8_ =
           ((long)vertices.
                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)vertices.
                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      testing::internal::CmpHelperEQ<int,unsigned_long>
                ((internal *)&gtest_ar,"nVertices","vertices.size()",&nVertices,
                 (unsigned_long *)&identity);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&identity);
        if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) ==
            (undefined8 *)0x0) {
          pcVar21 = "";
        }
        else {
          pcVar21 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mesh,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes_test.cpp"
                   ,0x40,pcVar21);
        testing::internal::AssertHelper::operator=((AssertHelper *)&mesh,(Message *)&identity);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mesh);
        if (identity.m.m[0]._0_8_ != 0) {
          bVar13 = testing::internal::IsTrue(true);
          if ((bVar13) && (identity.m.m[0]._0_8_ != 0)) {
            (**(code **)(*(long *)identity.m.m[0]._0_8_ + 8))();
          }
          identity.m.m[0][0] = 0.0;
          identity.m.m[0][1] = 0.0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      iVar17 = nPhi;
      indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (1 < nPhi) {
        iVar28 = nPhi + 1;
        iVar25 = 0;
        do {
          gtest_ar._0_8_ = gtest_ar._0_8_ & 0xffffffff00000000;
          if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish ==
              indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&indices,(iterator)
                                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish,(int *)&gtest_ar);
          }
          else {
            *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = 0;
            indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish ==
              indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            gtest_ar._0_4_ = iVar17 + iVar25;
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&indices,(iterator)
                                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish,(int *)&gtest_ar);
          }
          else {
            *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = iVar17 + iVar25;
            indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          gtest_ar._0_4_ = iVar28 + iVar25;
          if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish ==
              indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&indices,(iterator)
                                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish,(int *)&gtest_ar);
          }
          else {
            *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = gtest_ar._0_4_;
            indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          iVar25 = iVar25 + 1;
        } while (iVar25 < nPhi + -1);
      }
      auVar33 = local_3a8;
      if (3 < nTheta) {
        local_3a8._4_4_ = 0;
        local_3a8._0_4_ = iVar17 + 1;
        local_3a8._8_8_ = auVar33._8_8_;
        iVar28 = iVar17 * 2;
        iVar25 = iVar17 * 2 + 1;
        iVar19 = 1;
        iVar29 = iVar17;
        do {
          if (1 < nPhi) {
            iVar16 = 0;
            do {
              iVar26 = iVar29 + iVar16;
              if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                gtest_ar._0_4_ = iVar26;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&indices,(iterator)
                                    indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish,(int *)&gtest_ar);
              }
              else {
                *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar26;
                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              gtest_ar._0_4_ = iVar28 + iVar16;
              if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&indices,(iterator)
                                    indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish,(int *)&gtest_ar);
              }
              else {
                *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = gtest_ar._0_4_;
                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              iVar23 = iVar25 + iVar16;
              if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                gtest_ar._0_4_ = iVar23;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&indices,(iterator)
                                    indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish,(int *)&gtest_ar);
              }
              else {
                *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar23;
                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                gtest_ar._0_4_ = iVar26;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&indices,(iterator)
                                    indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish,(int *)&gtest_ar);
              }
              else {
                *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar26;
                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                gtest_ar._0_4_ = iVar23;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&indices,(iterator)
                                    indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish,(int *)&gtest_ar);
              }
              else {
                *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar23;
                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              gtest_ar._0_4_ = local_3a8._0_4_ + iVar16;
              if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&indices,(iterator)
                                    indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish,(int *)&gtest_ar);
              }
              else {
                *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = gtest_ar._0_4_;
                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              iVar16 = iVar16 + 1;
            } while (iVar16 < nPhi + -1);
          }
          auVar33 = local_3a8;
          iVar19 = iVar19 + 1;
          iVar16 = local_3a8._0_4_;
          local_3a8._4_4_ = 0;
          local_3a8._0_4_ = iVar16 + iVar17;
          local_3a8._8_8_ = auVar33._8_8_;
          iVar25 = iVar25 + iVar17;
          iVar29 = iVar29 + iVar17;
          iVar28 = iVar28 + iVar17;
        } while (iVar19 < nTheta + -2);
      }
      if (1 < nPhi) {
        iVar25 = 0;
        do {
          iVar28 = (nTheta + -1) * iVar17;
          if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish ==
              indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            gtest_ar._0_4_ = iVar28;
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&indices,(iterator)
                                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish,(int *)&gtest_ar);
          }
          else {
            *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = iVar28;
            indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          gtest_ar._0_4_ = (nTheta + -2) * iVar17 + iVar25;
          if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish ==
              indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&indices,(iterator)
                                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish,(int *)&gtest_ar);
          }
          else {
            *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = gtest_ar._0_4_;
            indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          gtest_ar._0_4_ = iVar25 + 1 + (nTheta + -2) * iVar17;
          if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish ==
              indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&indices,(iterator)
                                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish,(int *)&gtest_ar);
          }
          else {
            *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = gtest_ar._0_4_;
            indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          iVar25 = iVar25 + 1;
        } while (iVar25 < nPhi + -1);
      }
      pbrt::Transform::Transform(&identity);
      std::vector<int,_std::allocator<int>_>::vector(&local_2a8,&indices);
      uVar49 = 0;
      std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
                (&local_2c0,&vertices);
      local_e8.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_108 = (void *)0x0;
      uStack_100 = 0;
      local_f8 = 0;
      local_128 = (void *)0x0;
      uStack_120 = 0;
      local_118 = 0;
      local_148 = (void *)0x0;
      uStack_140 = 0;
      local_138 = 0;
      n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&local_128;
      n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_108;
      n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&local_148;
      uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = uVar49;
      uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x29ad03;
      uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffffc08;
      uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffffc0c;
      uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = nPhi;
      uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = nTheta;
      faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      pbrt::TriangleMesh::TriangleMesh
                (&mesh,&identity,false,&local_2a8,&local_2c0,&local_e8,n,uv,faceIndices);
      if (local_148 != (void *)0x0) {
        operator_delete(local_148,local_138 - (long)local_148);
      }
      if (local_128 != (void *)0x0) {
        operator_delete(local_128,local_118 - (long)local_128);
      }
      if (local_108 != (void *)0x0) {
        operator_delete(local_108,local_f8 - (long)local_108);
      }
      if (local_e8.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.
                        super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.
                              super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.
                              super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2c0.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2c0.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2c0.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2c0.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      alloc.memoryResource = pstd::pmr::new_delete_resource();
      pbrt::Triangle::CreateTriangles(&tris,&mesh,alloc);
      lVar31 = 0;
      do {
        uVar24 = ((ulong)(lVar31 * 0x7fb5d329728ea185) >> 0x1b ^ lVar31 * 0x7fb5d329728ea185) *
                 -0x7e25210b43d22bb3;
        uVar24 = ((uVar24 >> 0x21 ^ uVar24) + 1) * 0x5851f42d4c957f2d + lVar31 * -0x4f5c17a566d501a4
                 + 1;
        uVar1 = uVar24 * 0x5851f42d4c957f2d + 1 + lVar31 * 2;
        uVar2 = uVar1 * 0x5851f42d4c957f2d + 1 + lVar31 * 2;
        uVar18 = uVar2 * 0x5851f42d4c957f2d + 1 + lVar31 * 2;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = uVar24;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = uVar1;
        auVar33 = vpunpcklqdq_avx(auVar45,auVar37);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = uVar18;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = uVar2;
        auVar34 = vpunpcklqdq_avx(auVar46,auVar47);
        auVar40._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar34;
        auVar40._16_16_ = ZEXT116(1) * auVar33;
        auVar41 = vpsrlvq_avx2(auVar40,_DAT_005ca580);
        auVar5 = vpsrlvq_avx2(auVar40,_DAT_005ca560);
        auVar33 = vpmovqd_avx512vl(auVar5 ^ auVar41);
        auVar41 = vpsrlq_avx2(auVar40,0x3b);
        auVar34 = vpmovqd_avx512vl(auVar41);
        auVar33 = vprorvd_avx512vl(auVar33,auVar34);
        auVar33 = vcvtudq2ps_avx512vl(auVar33);
        auVar6._8_4_ = 0x2f800000;
        auVar6._0_8_ = 0x2f8000002f800000;
        auVar6._12_4_ = 0x2f800000;
        local_3a8 = vmulps_avx512vl(auVar33,auVar6);
        auVar7._8_4_ = 0x3f7fffff;
        auVar7._0_8_ = 0x3f7fffff3f7fffff;
        auVar7._12_4_ = 0x3f7fffff;
        uVar24 = vcmpps_avx512vl(local_3a8,auVar7,1);
        bVar15 = (byte)(uVar24 >> 3);
        auVar33 = vshufps_avx(local_3a8,local_3a8,0xff);
        auVar34 = vshufpd_avx(local_3a8,local_3a8,1);
        local_318 = vfmadd132ss_fma(ZEXT416((uint)(bVar15 & 1) * auVar33._0_4_ +
                                            (uint)!(bool)(bVar15 & 1) * 0x3f7fffff),
                                    SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
        auVar33 = vfnmadd213ss_fma(local_318,local_318,SUB6416(ZEXT464(0x3f800000),0));
        auVar33 = vmaxss_avx(auVar33,ZEXT816(0));
        if (auVar33._0_4_ < 0.0) {
          fVar35 = sqrtf(auVar33._0_4_);
          uVar24 = uVar24 & 0xffff;
        }
        else {
          auVar33 = vsqrtss_avx(auVar33,auVar33);
          fVar35 = auVar33._0_4_;
        }
        bVar15 = (byte)(uVar24 >> 2);
        auVar8._8_4_ = 0x3f7fffff;
        auVar8._0_8_ = 0x3f7fffff3f7fffff;
        auVar8._12_4_ = 0x3f7fffff;
        uVar24 = vcmpps_avx512vl(local_3a8,auVar8,1);
        bVar10 = (byte)(uVar24 >> 1);
        fVar32 = (float)((uint)(bVar15 & 1) * (int)(auVar34._0_4_ * 6.2831855) +
                        (uint)!(bool)(bVar15 & 1) * 0x40c90fda);
        local_328._0_4_ = cosf(fVar32);
        local_328._4_4_ = extraout_XMM0_Db_00;
        local_328._8_4_ = extraout_XMM0_Dc_00;
        local_328._12_4_ = extraout_XMM0_Dd_00;
        auVar44._0_4_ = sinf(fVar32);
        auVar44._4_60_ = extraout_var_01;
        fVar32 = (float)local_318._0_4_ * 0.5;
        auVar33 = vinsertps_avx(local_328,auVar44._0_16_,0x10);
        auVar38._0_4_ = fVar35 * auVar33._0_4_;
        auVar38._4_4_ = fVar35 * auVar33._4_4_;
        auVar38._8_4_ = fVar35 * auVar33._8_4_;
        auVar38._12_4_ = fVar35 * auVar33._12_4_;
        auVar9._8_4_ = 0x3f000000;
        auVar9._0_8_ = 0x3f0000003f000000;
        auVar9._12_4_ = 0x3f000000;
        local_328 = vmulps_avx512vl(auVar38,auVar9);
        auVar33 = vmovshdup_avx(local_3a8);
        fVar35 = local_3a8._0_4_;
        local_318 = vfmadd132ss_fma(ZEXT416((uint)(bVar10 & 1) * auVar33._0_4_ +
                                            (uint)!(bool)(bVar10 & 1) * 0x3f7fffff),
                                    SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
        auVar33 = vfnmadd213ss_fma(local_318,local_318,SUB6416(ZEXT464(0x3f800000),0));
        auVar33 = vmaxss_avx(auVar33,ZEXT816(0));
        if (auVar33._0_4_ < 0.0) {
          fVar36 = sqrtf(auVar33._0_4_);
        }
        else {
          auVar33 = vsqrtss_avx(auVar33,auVar33);
          fVar36 = auVar33._0_4_;
        }
        local_3a8._0_4_ = fVar36;
        local_368._4_4_ = local_328._4_4_ + 0.0;
        local_368._0_4_ = local_328._0_4_ + 0.0;
        fStack_360 = local_328._8_4_ + 0.0;
        fStack_35c = local_328._12_4_ + 0.0;
        fVar32 = fVar32 + 0.0;
        fVar35 = (float)((uint)((byte)uVar24 & 1) * (int)(fVar35 * 6.2831855) +
                        (uint)!(bool)((byte)uVar24 & 1) * 0x40c90fda);
        local_328 = ZEXT416((uint)fVar35);
        fVar35 = cosf(fVar35);
        fVar35 = fVar35 * (float)local_3a8._0_4_;
        fVar36 = sinf((float)local_328._0_4_);
        pSVar12 = tris.ptr;
        auVar33 = vinsertps_avx(ZEXT416((uint)fVar35),
                                ZEXT416((uint)(fVar36 * (float)local_3a8._0_4_)),0x10);
        local_2e8 = vmovlps_avx(_local_368);
        local_2dc = vmovlps_avx(auVar33);
        local_2d4 = local_318._0_4_;
        local_2d0 = 0;
        local_2c8 = 0;
        nHits = 0;
        local_2e0 = fVar32;
        if (tris.nStored != 0) {
          lVar30 = tris.nStored << 3;
          lVar27 = 0;
          do {
            local_3b0.data_._0_4_ = 0x7f800000;
            gtest_ar_4._0_8_ =
                 *(ulong *)((long)&(pSVar12->
                                   super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
                                   ).bits + lVar27);
            pbrt::detail::DispatchSplit<6>::operator()
                      (&gtest_ar,&local_3c5,&local_2e8,&local_3b0,&gtest_ar_4,
                       (ulong)gtest_ar_4._0_8_ >> 0x30);
            if (local_190 == '\x01') {
              nHits = nHits + 1;
            }
            lVar27 = lVar27 + 8;
          } while (lVar30 != lVar27);
        }
        gtest_ar_4._0_4_ = 1;
        testing::internal::CmpHelperGE<int,int>
                  ((internal *)&gtest_ar,"nHits","1",&nHits,(int *)&gtest_ar_4);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_4);
          pcVar21 = "";
          if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) !=
              (undefined8 *)0x0) {
            pcVar21 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_3b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes_test.cpp"
                     ,0x74,pcVar21);
          testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&gtest_ar_4);
          testing::internal::AssertHelper::~AssertHelper(&local_3b0);
          if (gtest_ar_4._0_8_ != 0) {
            bVar13 = testing::internal::IsTrue(true);
            if ((bVar13) && (gtest_ar_4._0_8_ != 0)) {
              (**(code **)(*(long *)gtest_ar_4._0_8_ + 8))();
            }
            gtest_ar_4.success_ = false;
            gtest_ar_4._1_7_ = 0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pSVar12 = tris.ptr;
        iVar17 = (int)((ulong)((long)vertices.
                                     super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)vertices.
                                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2);
        uVar22 = iVar17 * -0x55555555;
        do {
          uVar18 = uVar18 * 0x5851f42d4c957f2d + lVar31 * 2 + 1;
          uVar20 = (uint)(uVar18 >> 0x2d) ^ (uint)(uVar18 >> 0x1b);
          bVar15 = (byte)(uVar18 >> 0x3b);
          uVar20 = uVar20 >> bVar15 | uVar20 << 0x20 - bVar15;
        } while (uVar20 < (uint)(iVar17 * 0x55555555) % uVar22);
        uVar24 = (ulong)uVar20 % (ulong)uVar22;
        local_2d4 = vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar24].
                    super_Tuple3<pbrt::Point3,_float>.z;
        uVar3 = vertices.
                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar24].super_Tuple3<pbrt::Point3,_float>.x
        ;
        uVar4 = vertices.
                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar24].super_Tuple3<pbrt::Point3,_float>.y
        ;
        auVar48._4_4_ = uVar4;
        auVar48._0_4_ = uVar3;
        auVar48._8_8_ = 0;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = local_2e8;
        auVar33 = vsubps_avx(auVar48,auVar39);
        local_3a8._0_4_ = local_2d4;
        local_2d4 = local_2d4 - local_2e0;
        local_2dc = vmovlps_avx(auVar33);
        nHits = 0;
        if (tris.nStored != 0) {
          lVar30 = tris.nStored << 3;
          lVar27 = 0;
          do {
            local_3b0.data_._0_4_ = 0x7f800000;
            gtest_ar_4._0_8_ =
                 *(ulong *)((long)&(pSVar12->
                                   super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
                                   ).bits + lVar27);
            pbrt::detail::DispatchSplit<6>::operator()
                      (&gtest_ar,&local_3c5,&local_2e8,&local_3b0,&gtest_ar_4,
                       (ulong)gtest_ar_4._0_8_ >> 0x30);
            if (local_190 == '\x01') {
              nHits = nHits + 1;
            }
            lVar27 = lVar27 + 8;
          } while (lVar30 != lVar27);
        }
        gtest_ar._0_4_ = 1;
        testing::internal::CmpHelperGE<int,int>
                  ((internal *)&gtest_ar_4,"nHits","1",&nHits,(int *)&gtest_ar);
        if (gtest_ar_4.success_ == false) {
          testing::Message::Message((Message *)&local_3b0);
          AVar11.data_ = local_3b0.data_;
          vmovshdup_avx(auVar48);
          pbrt::internal::ToString3<float>(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08,0.0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(AVar11.data_)->line,(char *)gtest_ar._0_8_,
                     CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_));
          if ((long *)gtest_ar._0_8_ != local_280) {
            operator_delete((void *)gtest_ar._0_8_,local_280[0] + 1);
          }
          pcVar21 = "";
          if (gtest_ar_4.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar21 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes_test.cpp"
                     ,0x7e,pcVar21);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar,(Message *)&local_3b0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
          if (local_3b0.data_ != (AssertHelperData *)0x0) {
            bVar13 = testing::internal::IsTrue(true);
            if ((bVar13) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_3b0.data_ + 8))();
            }
            local_3b0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar_4.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        lVar31 = lVar31 + 1;
      } while (lVar31 != 100000);
      tris.nStored = 0;
      (*(tris.alloc.memoryResource)->_vptr_memory_resource[3])
                (tris.alloc.memoryResource,tris.ptr,tris.nAlloc << 3,8);
      if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (vertices.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vertices.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)vertices.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vertices.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

TEST(Triangle, Watertight) {
    RNG rng(12111);
    int nTheta = 16, nPhi = 16;
    ASSERT_GE(nTheta, 3);
    ASSERT_GE(nPhi, 4);

    // Make a triangle mesh representing a triangulated sphere (with
    // vertices randomly offset along their normal), centered at the
    // origin.
    int nVertices = nTheta * nPhi;
    std::vector<Point3f> vertices;
    for (int t = 0; t < nTheta; ++t) {
        Float theta = Pi * (Float)t / (Float)(nTheta - 1);
        Float cosTheta = std::cos(theta);
        Float sinTheta = std::sin(theta);
        for (int p = 0; p < nPhi; ++p) {
            Float phi = 2 * Pi * (Float)p / (Float)(nPhi - 1);
            Float radius = 1;
            // Make sure all of the top and bottom vertices are coincident.
            if (t == 0)
                vertices.push_back(Point3f(0, 0, radius));
            else if (t == nTheta - 1)
                vertices.push_back(Point3f(0, 0, -radius));
            else if (p == nPhi - 1)
                // Close it up exactly at the end
                vertices.push_back(vertices[vertices.size() - (nPhi - 1)]);
            else {
                radius += 5 * rng.Uniform<Float>();
                vertices.push_back(Point3f(0, 0, 0) +
                                   radius * SphericalDirection(sinTheta, cosTheta, phi));
            }
        }
    }
    EXPECT_EQ(nVertices, vertices.size());

    std::vector<int> indices;
    // fan at top
    auto offset = [nPhi](int t, int p) { return t * nPhi + p; };
    for (int p = 0; p < nPhi - 1; ++p) {
        indices.push_back(offset(0, 0));
        indices.push_back(offset(1, p));
        indices.push_back(offset(1, p + 1));
    }

    // quads in the middle rows
    for (int t = 1; t < nTheta - 2; ++t) {
        for (int p = 0; p < nPhi - 1; ++p) {
            indices.push_back(offset(t, p));
            indices.push_back(offset(t + 1, p));
            indices.push_back(offset(t + 1, p + 1));

            indices.push_back(offset(t, p));
            indices.push_back(offset(t + 1, p + 1));
            indices.push_back(offset(t, p + 1));
        }
    }

    // fan at bottom
    for (int p = 0; p < nPhi - 1; ++p) {
        indices.push_back(offset(nTheta - 1, 0));
        indices.push_back(offset(nTheta - 2, p));
        indices.push_back(offset(nTheta - 2, p + 1));
    }

    Transform identity;
    TriangleMesh mesh(identity, false, indices, vertices, {}, {}, {}, {});
    pstd::vector<ShapeHandle> tris = Triangle::CreateTriangles(&mesh, Allocator());

    for (int i = 0; i < 100000; ++i) {
        RNG rng(i);
        // Choose a random point in sphere of radius 0.5 around the origin.
        Point2f u;
        u[0] = rng.Uniform<Float>();
        u[1] = rng.Uniform<Float>();
        Point3f p = Point3f(0, 0, 0) + Float(0.5) * SampleUniformSphere(u);

        // Choose a random direction.
        u[0] = rng.Uniform<Float>();
        u[1] = rng.Uniform<Float>();
        Ray r(p, SampleUniformSphere(u));
        int nHits = 0;
        for (const auto &tri : tris) {
            if (tri.Intersect(r))
                ++nHits;
        }
        EXPECT_GE(nHits, 1);

        // Now tougher: shoot directly at a vertex.
        Point3f pVertex = vertices[rng.Uniform<uint32_t>(vertices.size())];
        r.d = pVertex - r.o;
        nHits = 0;
        for (const auto &tri : tris) {
            if (tri.Intersect(r).has_value())
                ++nHits;
        }
        EXPECT_GE(nHits, 1) << pVertex;
    }
}